

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void __thiscall
pbrt::AsyncJob<pbrt::Image_*>::RunStep(AsyncJob<pbrt::Image_*> *this,unique_lock<std::mutex> *lock)

{
  ParallelJob *in_RDI;
  unique_lock<std::mutex> ul;
  Image *r;
  mutex_type *in_stack_ffffffffffffffb8;
  
  ThreadPool::RemoveFromJobList(ParallelJob::threadPool,in_RDI);
  in_RDI[1].removed = true;
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_RDI);
  std::function<pbrt::Image_*()>::operator()((function<pbrt::Image_*()> *)in_RDI);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  pstd::optional<pbrt::Image_*>::operator=
            ((optional<pbrt::Image_*> *)in_RDI,(Image **)in_stack_ffffffffffffffb8);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  return;
}

Assistant:

void RunStep(std::unique_lock<std::mutex> *lock) {
        threadPool->RemoveFromJobList(this);
        started = true;
        lock->unlock();
        // Execute asynchronous work and notify waiting threads of its completion
        T r = func();
        std::unique_lock<std::mutex> ul(mutex);
        result = r;
        cv.notify_all();
    }